

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_58494::ParserImpl::ParseNumericForStatement(ParserImpl *this)

{
  TokenDetail *pTVar1;
  ParserImpl *this_00;
  undefined8 uVar2;
  NumericForStatement *this_01;
  long in_RSI;
  tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_> in_RDI;
  int in_stack_0000003c;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_00000040;
  ParserImpl *in_stack_00000048;
  TokenDetail in_stack_00000060;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> block;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> exp3;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> exp2;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> exp1;
  TokenDetail name;
  anon_union_8_2_010d16d7_for_TokenDetail_0 __p;
  ParserImpl *in_stack_fffffffffffffe60;
  ParserImpl *this_02;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *this_03;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_fffffffffffffe78;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *exp3_00;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *exp2_00;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *exp1_00;
  TokenDetail *in_stack_fffffffffffffed0;
  _Head_base<0UL,_luna::SyntaxTree_*,_false> this_04;
  undefined1 local_100 [24];
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> local_e8 [2];
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_d8;
  ParserImpl *pPStack_d0;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *puStack_c0;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_a0;
  ParserImpl *pPStack_98;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *puStack_88;
  undefined1 local_60 [48];
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_30;
  String *local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  this_04._M_head_impl =
       (SyntaxTree *)
       in_RDI.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
       super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  pTVar1 = NextToken(in_stack_fffffffffffffe60);
  local_30 = pTVar1->field_0;
  local_28 = pTVar1->module_;
  local_20._0_4_ = pTVar1->line_;
  local_20._4_4_ = pTVar1->column_;
  local_18 = *(undefined8 *)&pTVar1->token_;
  if (*(int *)(in_RSI + 0x20) != 0x115) {
    __assert_fail("current_.token_ == Token_Id",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                  ,0x1c9,
                  "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseNumericForStatement()"
                 );
  }
  NextToken(in_stack_fffffffffffffe60);
  if (*(int *)(in_RSI + 0x20) != 0x3d) {
    __assert_fail("current_.token_ == \'=\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                  ,0x1cc,
                  "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseNumericForStatement()"
                 );
  }
  std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
  unique_ptr<std::default_delete<luna::SyntaxTree>,void>
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             in_stack_fffffffffffffe60);
  luna::TokenDetail::TokenDetail((TokenDetail *)local_60);
  ParseExp(in_stack_00000048,in_stack_00000040,in_stack_00000060,in_stack_0000003c);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)local_60._24_8_
            );
  this_00 = (ParserImpl *)NextToken((ParserImpl *)local_60._8_8_);
  if ((this_00->current_).line_ != 0x2c) {
    pTVar1 = (TokenDetail *)__cxa_allocate_exception(0x20);
    luna::ParseException::ParseException
              ((ParseException *)this_04._M_head_impl,(char *)this_00,pTVar1);
    __cxa_throw(pTVar1,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
  }
  std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
  unique_ptr<std::default_delete<luna::SyntaxTree>,void>
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)local_60._8_8_)
  ;
  luna::TokenDetail::TokenDetail((TokenDetail *)&local_a0);
  ParseExp(in_stack_00000048,in_stack_00000040,in_stack_00000060,in_stack_0000003c);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(puStack_88)
  ;
  std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
  unique_ptr<std::default_delete<luna::SyntaxTree>,void>
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)pPStack_98);
  pTVar1 = LookAhead(pPStack_98);
  __p = local_a0;
  this_02 = pPStack_98;
  this_03 = puStack_88;
  if (pTVar1->token_ == 0x2c) {
    NextToken(pPStack_98);
    std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
    unique_ptr<std::default_delete<luna::SyntaxTree>,void>
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)pPStack_98);
    luna::TokenDetail::TokenDetail((TokenDetail *)&local_d8);
    ParseExp(in_stack_00000048,in_stack_00000040,in_stack_00000060,in_stack_0000003c);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator=
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)pPStack_d0,
               (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)local_d8.str_
              );
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              (puStack_c0);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              (puStack_c0);
    __p = local_d8;
    this_02 = pPStack_d0;
    this_03 = puStack_c0;
  }
  pTVar1 = NextToken(this_02);
  if (pTVar1->token_ != 0x102) {
    uVar2 = __cxa_allocate_exception(0x20);
    luna::ParseException::ParseException
              ((ParseException *)this_04._M_head_impl,(char *)this_00,in_stack_fffffffffffffed0);
    __cxa_throw(uVar2,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
  }
  ParseBlock(this_00);
  pTVar1 = NextToken(this_02);
  if (pTVar1->token_ != 0x105) {
    uVar2 = __cxa_allocate_exception(0x20);
    luna::ParseException::ParseException
              ((ParseException *)this_04._M_head_impl,(char *)this_00,in_stack_fffffffffffffed0);
    __cxa_throw(uVar2,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
  }
  this_01 = (NumericForStatement *)operator_new(0x48);
  exp3_00 = local_e8;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)this_02,
             (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)__p.str_);
  exp2_00 = (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
            (local_100 + 0x10);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)this_02,
             (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)__p.str_);
  exp1_00 = (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)(local_100 + 8);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)this_02,
             (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)__p.str_);
  pTVar1 = (TokenDetail *)local_100;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)this_02,
             (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)__p.str_);
  luna::NumericForStatement::NumericForStatement
            (this_01,pTVar1,exp1_00,exp2_00,exp3_00,in_stack_fffffffffffffe78);
  std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
  unique_ptr<std::default_delete<luna::SyntaxTree>,void>
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)this_02,
             (pointer)__p.str_);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(this_03);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(this_03);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(this_03);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(this_03);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(this_03);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(this_03);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(this_03);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(this_03);
  return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         in_RDI.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
         super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<SyntaxTree> ParseNumericForStatement()
        {
            TokenDetail name = NextToken();
            assert(current_.token_ == Token_Id);

            NextToken();                // skip '='
            assert(current_.token_ == '=');

            std::unique_ptr<SyntaxTree> exp1 = ParseExp();
            if (NextToken().token_ != ',')
                throw ParseException("expect ',' in numeric-for", current_);

            std::unique_ptr<SyntaxTree> exp2 = ParseExp();
            std::unique_ptr<SyntaxTree> exp3;

            if (LookAhead().token_ == ',')
            {
                NextToken();            // skip ','
                exp3 = ParseExp();
            }

            if (NextToken().token_ != Token_Do)
                throw ParseException("expect 'do' to start numeric-for body", current_);
            std::unique_ptr<SyntaxTree> block = ParseBlock();

            if (NextToken().token_ != Token_End)
                throw ParseException("expect 'end' to complete numeric-for", current_);
            return std::unique_ptr<SyntaxTree>(new NumericForStatement(name,
                                                                       std::move(exp1), std::move(exp2),
                                                                       std::move(exp3), std::move(block)));
        }